

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

double duckdb::Cast::Operation<duckdb::hugeint_t,double>(hugeint_t input)

{
  hugeint_t hVar1;
  bool bVar2;
  InvalidInputException *this;
  int64_t in_RSI;
  uint64_t in_RDI;
  double result;
  undefined1 in_stack_00000190 [16];
  string local_48 [48];
  double local_18 [3];
  
  hVar1.upper = in_RSI;
  hVar1.lower = in_RDI;
  bVar2 = duckdb::TryCast::Operation<duckdb::hugeint_t,double>(hVar1,local_18,false);
  if (!bVar2) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::hugeint_t,double>((hugeint_t)in_stack_00000190);
    duckdb::InvalidInputException::InvalidInputException(this,local_48);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_18[0];
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}